

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::anon_unknown_0::SeparateProgramsVertex::CreateShaderProgram
          (SeparateProgramsVertex *this,GLenum type,GLsizei count,GLchar **strings)

{
  GLuint program;
  CallLogWrapper *this_00;
  GLsizei length;
  GLint status;
  GLchar log [1024];
  int local_420;
  GLint local_41c;
  GLchar local_418 [1024];
  
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateShaderProgramv(this_00,type,count,strings);
  local_41c = 1;
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_41c);
  if (local_41c == 0) {
    glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x400,&local_420,local_418);
    if (1 < local_420) {
      anon_unknown_0::Output("Program Info Log:\n%s\n",local_418);
    }
  }
  return program;
}

Assistant:

virtual GLuint CreateShaderProgram(GLenum type, GLsizei count, const GLchar** strings)
	{
		GLuint program = glCreateShaderProgramv(type, count, strings);
		GLint  status  = GL_TRUE;
		glGetProgramiv(program, GL_LINK_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLsizei length;
			GLchar  log[1024];
			glGetProgramInfoLog(program, sizeof(log), &length, log);
			if (length > 1)
			{
				Output("Program Info Log:\n%s\n", log);
			}
		}
		return program;
	}